

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

bool __thiscall cmFileLockPool::ScopePool::IsAlreadyLocked(ScopePool *this,string *filename)

{
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<cmFileLock_*const_*,_std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>_>
  local_30;
  __normal_iterator<cmFileLock_*const_*,_std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>_>
  local_28;
  CIt i;
  string *filename_local;
  ScopePool *this_local;
  
  i._M_current = (cmFileLock **)filename;
  local_28._M_current =
       (cmFileLock **)std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>::begin(&this->Locks);
  while( true ) {
    local_30._M_current =
         (cmFileLock **)std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>::end(&this->Locks);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return false;
    }
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmFileLock_*const_*,_std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>_>
              ::operator*(&local_28);
    bVar1 = cmFileLock::IsLocked(*ppcVar2,(string *)i._M_current);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<cmFileLock_*const_*,_std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>_>
    ::operator++(&local_28);
  }
  return true;
}

Assistant:

bool cmFileLockPool::ScopePool::IsAlreadyLocked(
  const std::string& filename) const
{
  for (CIt i = this->Locks.begin(); i != this->Locks.end(); ++i) {
    if ((*i)->IsLocked(filename)) {
      return true;
    }
  }
  return false;
}